

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O0

void __thiscall
Eigen::internal::CompressedStorage<double,_int>::reserve
          (CompressedStorage<double,_int> *this,Index size)

{
  long size_00;
  Index newAllocatedSize;
  Index size_local;
  CompressedStorage<double,_int> *this_local;
  
  size_00 = this->m_size + size;
  if (this->m_allocatedSize < size_00) {
    reallocate(this,size_00);
  }
  return;
}

Assistant:

void reserve(Index size)
    {
      Index newAllocatedSize = m_size + size;
      if (newAllocatedSize > m_allocatedSize)
        reallocate(newAllocatedSize);
    }